

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_alGenSources(CallerInfo *callerinfo,ALsizei n,ALuint *orignames,ALuint *names)

{
  char *pcVar1;
  char *pcVar2;
  int local_2c;
  ALsizei i;
  ALuint *names_local;
  ALuint *orignames_local;
  ALsizei n_local;
  CallerInfo *callerinfo_local;
  
  pcVar1 = ptrString(orignames);
  printf("(%u, %s)",(ulong)(uint)n,pcVar1);
  if (orignames != (ALuint *)0x0) {
    printf(" => {");
    for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (0 < local_2c) {
        pcVar1 = ",";
      }
      pcVar2 = sourceString(names[local_2c]);
      printf("%s %s",pcVar1,pcVar2);
    }
    pcVar1 = "";
    if (0 < n) {
      pcVar1 = " ";
    }
    printf("%s}",pcVar1);
  }
  printf("\n");
  return;
}

Assistant:

static void dump_alGenSources(CallerInfo *callerinfo, ALsizei n, ALuint *orignames, ALuint *names)
{
    ALsizei i;
    printf("(%u, %s)", (uint) n, ptrString(orignames));
    if (orignames) {
        printf(" => {");
        for (i = 0; i < n; i++) {
#pragma warning can overflow ioblob array
            printf("%s %s", i > 0 ? "," : "", sourceString(names[i]));
        }
        printf("%s}", n > 0 ? " " : "");
    }
    printf("\n");
}